

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O0

int __thiscall
QWindowsStyle::pixelMetric(QWindowsStyle *this,PixelMetric pm,QStyleOption *opt,QWidget *widget)

{
  TickPosition TVar1;
  int iVar2;
  QStyleOptionSlider *pQVar3;
  QStyle *pQVar4;
  QWidget *in_RCX;
  QStyleOption *in_RDX;
  PixelMetric in_ESI;
  qreal in_RDI;
  qreal qVar5;
  int thick;
  int n;
  int ticks;
  int space;
  QStyleOptionSlider *sl;
  int ret;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_48;
  uint local_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  int local_4;
  
  local_4 = QWindowsStylePrivate::pixelMetricFromSystemDp(in_ESI,in_RDX,in_RCX);
  if (local_4 == -0x5c18) {
    iVar2 = QWindowsStylePrivate::fixedPixelMetric(in_ESI);
    if (iVar2 == -0x5c18) {
      local_2c = 0;
      if (in_ESI == PM_MaximumDragDistance) {
        local_2c = QCommonStyle::pixelMetric((QCommonStyle *)widget,ret,(QStyleOption *)sl,_ticks);
        if (local_2c == -1) {
          local_2c = 0x3c;
        }
      }
      else if (in_ESI == PM_SliderControlThickness) {
        pQVar3 = qstyleoption_cast<QStyleOptionSlider_const*>(in_RDX);
        if (pQVar3 != (QStyleOptionSlider *)0x0) {
          if (pQVar3->orientation == Horizontal) {
            local_2c = QRect::height((QRect *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8));
          }
          else {
            local_2c = QRect::width((QRect *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8));
          }
          TVar1 = pQVar3->tickPosition;
          local_44 = (uint)((TVar1 & TicksAbove) != NoTicks);
          if ((TVar1 & TicksBelow) != NoTicks) {
            local_44 = local_44 + 1;
          }
          if (local_44 != 0) {
            local_48 = 6;
            if ((TVar1 != TicksBothSides) && (TVar1 != NoTicks)) {
              pQVar4 = QStyle::proxy((QStyle *)CONCAT44(local_2c,TVar1));
              iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0xd,pQVar3,in_RCX);
              local_48 = iVar2 / 4 + 6;
            }
            if (0 < local_2c - local_48) {
              local_48 = ((local_2c - local_48) * 2) / (int)(local_44 + 2) + local_48;
            }
            local_2c = local_48;
          }
        }
      }
      else if (in_ESI == PM_SplitterWidth) {
        qVar5 = QStyleHelper::dpiScaled
                          (in_RDI,(QStyleOption *)CONCAT44(0x19,in_stack_ffffffffffffffa8));
        local_2c = (int)qVar5;
      }
      else if (in_ESI == PM_IconViewIconSize) {
        pQVar4 = QStyle::proxy((QStyle *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        local_2c = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x3f,in_RDX,in_RCX);
      }
      else {
        local_2c = QCommonStyle::pixelMetric((QCommonStyle *)widget,ret,(QStyleOption *)sl,_ticks);
      }
      local_4 = local_2c;
    }
    else {
      qVar5 = QStyleHelper::dpiScaled
                        (in_RDI,(QStyleOption *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      local_4 = (int)qVar5;
    }
  }
  return local_4;
}

Assistant:

int QWindowsStyle::pixelMetric(PixelMetric pm, const QStyleOption *opt, const QWidget *widget) const
{
    int ret = QWindowsStylePrivate::pixelMetricFromSystemDp(pm, opt, widget);
    if (ret != QWindowsStylePrivate::InvalidMetric)
        return ret;

    ret = QWindowsStylePrivate::fixedPixelMetric(pm);
    if (ret != QWindowsStylePrivate::InvalidMetric)
        return int(QStyleHelper::dpiScaled(ret, opt));

    ret = 0;

    switch (pm) {
    case PM_MaximumDragDistance:
        ret = QCommonStyle::pixelMetric(PM_MaximumDragDistance, opt, widget);
        if (ret == -1)
            ret = 60;
        break;

#if QT_CONFIG(slider)
        // Returns the number of pixels to use for the business part of the
        // slider (i.e., the non-tickmark portion). The remaining space is shared
        // equally between the tickmark regions.
    case PM_SliderControlThickness:
        if (const QStyleOptionSlider *sl = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            int space = (sl->orientation == Qt::Horizontal) ? sl->rect.height() : sl->rect.width();
            int ticks = sl->tickPosition;
            int n = 0;
            if (ticks & QSlider::TicksAbove)
                ++n;
            if (ticks & QSlider::TicksBelow)
                ++n;
            if (!n) {
                ret = space;
                break;
            }

            int thick = 6;        // Magic constant to get 5 + 16 + 5
            if (ticks != QSlider::TicksBothSides && ticks != QSlider::NoTicks)
                thick += proxy()->pixelMetric(PM_SliderLength, sl, widget) / 4;

            space -= thick;
            if (space > 0)
                thick += (space * 2) / (n + 2);
            ret = thick;
        }
        break;
#endif // QT_CONFIG(slider)

    case PM_IconViewIconSize:
        ret = proxy()->pixelMetric(PM_LargeIconSize, opt, widget);
        break;

    case PM_SplitterWidth:
        ret = QStyleHelper::dpiScaled(4, opt);
        break;

    default:
        ret = QCommonStyle::pixelMetric(pm, opt, widget);
        break;
    }

    return ret;
}